

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  pointer __first;
  pointer __last;
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  ostream *poVar4;
  size_t i;
  char *pcVar5;
  int iVar6;
  string *psVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  vector<int,_std::allocator<int>_> counts;
  _Temporary_buffer<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_int>
  local_78;
  undefined8 local_60;
  ulong local_58;
  void *mmioAddress;
  vector<int,_std::allocator<int>_> counterIndices;
  
  iVar1 = pci_system_init();
  if (iVar1 == 0) {
    local_78._M_original_len._0_4_ = 0x1002;
    local_78._M_original_len._4_4_ = 0xffffffff;
    local_78._M_len._0_4_ = 0xffffffff;
    local_78._M_len._4_4_ = 0xffffffff;
    local_78._M_buffer = (int *)0xff000000030000;
    local_60 = 0;
    uVar2 = pci_id_match_iterator_create();
    do {
      lVar3 = pci_device_next(uVar2);
      if (lVar3 == 0) {
        pci_iterator_destroy(uVar2);
        pcVar5 = "could not find an AMD TONGA GPU\n";
        goto LAB_001027d0;
      }
    } while ((*(ushort *)(lVar3 + 8) & 0xfffe) != 0x6938);
    pci_iterator_destroy(uVar2);
    iVar1 = pci_device_probe(lVar3);
    if (iVar1 == 0) {
      if (*(short *)(lVar3 + 6) == 0x1002) {
        iVar1 = pci_device_map_range(lVar3,*(undefined8 *)(lVar3 + 0xf0),0x40000,0,&mmioAddress);
        if (iVar1 == 0) {
          std::vector<int,_std::allocator<int>_>::vector
                    (&counterIndices,(DAT_00106138 - (anonymous_namespace)::counters) / 0x30,
                     (allocator_type *)&local_78);
          for (lVar3 = 0;
              (long)counterIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)counterIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2 != lVar3; lVar3 = lVar3 + 1) {
            counterIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar3] = (int)lVar3;
          }
          do {
            std::vector<int,_std::allocator<int>_>::vector
                      (&counts,(DAT_00106138 - (anonymous_namespace)::counters) / 0x30,
                       (allocator_type *)&local_78);
            iVar1 = 0;
            lVar3 = std::chrono::_V2::steady_clock::now();
            while (__last = counterIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish,
                  __first = counterIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start, iVar1 != 100) {
              pcVar5 = (char *)((anonymous_namespace)::counters + 0x28);
              for (lVar8 = 0;
                  (long)counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2 != lVar8; lVar8 = lVar8 + 1) {
                if (((*(uint *)(pcVar5 + -4) &
                     *(uint *)((long)mmioAddress + (ulong)*(uint *)(pcVar5 + -8) * 4)) == 0) ==
                    (bool)*pcVar5) {
                  counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar8] =
                       counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar8] + 1;
                }
                pcVar5 = pcVar5 + 0x30;
              }
              lVar8 = std::chrono::_V2::steady_clock::now();
              iVar1 = iVar1 + 1;
              usleep(iVar1 * 10000 + (int)((lVar8 - lVar3) / -1000));
            }
            if (counterIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start !=
                counterIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              std::
              _Temporary_buffer<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_int>
              ::_Temporary_buffer(&local_78,
                                  (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                  )counterIndices.super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start,
                                  (((long)counterIndices.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_finish -
                                    (long)counterIndices.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start >> 2) + 1) / 2);
              if (local_78._M_buffer == (int *)0x0) {
                std::
                __inplace_stable_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                          ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                           __first,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                    )__last,
                           (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_BNieuwenhuizen[P]amd_gpu_top_source_main_cpp:180:59)>
                            )&counts);
              }
              else {
                std::
                __stable_sort_adaptive<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int*,long,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                          ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                           __first,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                    )__last,local_78._M_buffer,
                           CONCAT44(local_78._M_len._4_4_,(undefined4)local_78._M_len),
                           (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_BNieuwenhuizen[P]amd_gpu_top_source_main_cpp:180:59)>
                            )&counts);
              }
              operator_delete(local_78._M_buffer);
            }
            std::operator<<((ostream *)&std::cout,"\x1b[2J\x1b[1;1H");
            std::ostream::flush();
            uVar10 = 0;
            while (uVar10 < (ulong)((DAT_00106138 - (anonymous_namespace)::counters) / 0x30)) {
              psVar7 = (string *)
                       ((anonymous_namespace)::counters +
                       (long)counterIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar10] * 0x30);
              iVar1 = counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start
                      [counterIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar10]];
              *(undefined8 *)(pci_device_next + *(long *)(std::cout + -0x18)) = 10;
              local_58 = uVar10;
              poVar4 = std::operator<<((ostream *)&std::cout,psVar7);
              poVar4 = std::operator<<(poVar4," ");
              *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 3;
              poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar1);
              poVar4 = std::operator<<(poVar4,"% ");
              *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0;
              iVar6 = (int)((long)iVar1 / 4);
              uVar10 = 0;
              if (0 < iVar6) {
                uVar10 = (long)iVar1 / 4 & 0xffffffff;
              }
              while (iVar9 = (int)uVar10, uVar10 = (ulong)(iVar9 - 1), iVar9 != 0) {
                std::operator<<((ostream *)&std::cout,anon_var_dwarf_7952);
              }
              std::operator<<((ostream *)&std::cout,
                              _ZN12_GLOBAL__N_14barsE_rel +
                              *(int *)(_ZN12_GLOBAL__N_14barsE_rel + (long)((iVar1 * 2) % 8) * 4));
              iVar6 = iVar6 + -1;
              while (iVar6 = iVar6 + 1, iVar6 < 0x1f) {
                std::operator<<((ostream *)&std::cout," ");
              }
              std::operator<<((ostream *)&std::cout,"\n");
              uVar10 = local_58 + 1;
            }
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      (&counts.super__Vector_base<int,_std::allocator<int>_>);
          } while( true );
        }
        pcVar5 = "mmio mem map failed (try to run as root)\n";
      }
      else {
        pcVar5 = "Graphics card is not identified\n";
      }
    }
    else {
      pcVar5 = "could not probe GPU\n";
    }
  }
  else {
    pcVar5 = "could not initialize PCI\n";
  }
LAB_001027d0:
  std::operator<<((ostream *)&std::cerr,pcVar5);
  exit(1);
}

Assistant:

int main()
{
    auto dev = getPCIDevice(); // yes, we leak this
    int sampleCount = 100;

    void* mmioAddress;

    // TODO: better selection of region & size
    if(pci_device_map_range(dev, dev->regions[5].base_addr, 0x40000, 0, &mmioAddress)) {
        std::cerr << "mmio mem map failed (try to run as root)\n";
        std::exit(1);
    }

    std::vector<int> counterIndices(counters.size());
    for(std::size_t i = 0; i < counterIndices.size(); ++i)
        counterIndices[i] = i;

    for(;;) {

        std::vector<int> counts(counters.size());

        auto startTime = std::chrono::steady_clock::now();
        auto interval = 1000000 / sampleCount;

        for(int i = 0; i < sampleCount; ++i) {
            for(std::size_t i = 0; i < counts.size(); ++i) {
                if(counters[i].isIdle) {
                    if(!(readReg(mmioAddress, counters[i].index) & counters[i].mask))
                        ++counts[i];
                } else {
                    if(readReg(mmioAddress, counters[i].index) & counters[i].mask)
                        ++counts[i];
                }
            }

            auto currentTime = std::chrono::steady_clock::now();
            auto elapsed = std::chrono::duration_cast<std::chrono::microseconds>(currentTime - startTime);
            usleep((i + 1) * interval - elapsed.count());
        }

        std::stable_sort(
            counterIndices.begin(), counterIndices.end(), [&counts](int a, int b) { return counts[a] > counts[b]; });

        std::cout << "\033[2J\033[1;1H" << std::flush; // clears screen

        for(std::size_t i = 0; i < counters.size(); ++i) {
            printCounter(std::cout, counters[counterIndices[i]].name, counts[counterIndices[i]] * 100 / sampleCount);
            std::cout << "\n";
        }
    }
}